

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_IPIStream.cpp
# Opt level: O2

ErrorCode PDB::HasValidIPIStream(RawFile *file)

{
  ErrorCode EVar1;
  DirectMSFStream stream;
  StreamHeader header;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>(&stream,file,4);
  if (stream.m_size < 0x38) {
    EVar1 = InvalidStream;
  }
  else {
    DirectMSFStream::ReadAtOffset<PDB::IPI::StreamHeader>(&header,&stream,0);
    EVar1 = UnknownVersion;
    if (header.version == V80) {
      EVar1 = Success;
    }
  }
  return EVar1;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::HasValidIPIStream(const RawFile& file) PDB_NO_EXCEPT
{
	DirectMSFStream stream = file.CreateMSFStream<DirectMSFStream>(IPIStreamIndex);
	if (stream.GetSize() < sizeof(IPI::StreamHeader))
	{
		return ErrorCode::InvalidStream;
	}

	const IPI::StreamHeader header = stream.ReadAtOffset<IPI::StreamHeader>(0u);
	if (header.version != IPI::StreamHeader::Version::V80)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}